

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

Printer * __thiscall cppgenerate::Printer::print(Printer *this)

{
  Class *pCVar1;
  vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_> *__range1;
  Class *cls;
  Class *this_00;
  
  pCVar1 = (this->m_classes).
           super__Vector_base<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_classes).
                 super__Vector_base<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>._M_impl
                 .super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1) {
    Class::print(this_00,(ostream *)&std::cout,(ostream *)&std::cout);
  }
  return this;
}

Assistant:

Printer& Printer::print(){
    //std::ostream single;

    if( m_generateAsSingleFile ){
        //single = std::ostream( "jksldaf" );
    }

    for( const Class& cls : m_classes ){
        //std::ostream output( std::cout );

        //if( m_generateAsSingleFile ) output = single;
        cls.print( std::cout, std::cout );
    }
    return *this;
}